

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedEnergyPrecisionAimpoint.cpp
# Opt level: O3

void __thiscall
DIS::DirectedEnergyPrecisionAimpoint::DirectedEnergyPrecisionAimpoint
          (DirectedEnergyPrecisionAimpoint *this)

{
  this->_vptr_DirectedEnergyPrecisionAimpoint =
       (_func_int **)&PTR__DirectedEnergyPrecisionAimpoint_001b41f0;
  this->_recordType = 4000;
  this->_recordLength = 0x58;
  this->_padding = 0;
  Vector3Double::Vector3Double(&this->_targetSpotLocation);
  Vector3Float::Vector3Float(&this->_targetSpotEntityLocation);
  Vector3Float::Vector3Float(&this->_targetSpotVelocity);
  Vector3Float::Vector3Float(&this->_targetSpotAcceleration);
  EntityID::EntityID(&this->_targetEntityID);
  this->_targetComponentID = '\0';
  this->_SpotShape = '\0';
  this->_BeamSpotXSecSemiMajorAxis = 0.0;
  this->_BeamSpotCrossSectionSemiMinorAxis = 0.0;
  this->_BeamSpotCrossSectionOrientAngle = 0.0;
  return;
}

Assistant:

DirectedEnergyPrecisionAimpoint::DirectedEnergyPrecisionAimpoint():
   _recordType(4000), 
   _recordLength(88), 
   _padding(0), 
   _targetSpotLocation(), 
   _targetSpotEntityLocation(), 
   _targetSpotVelocity(), 
   _targetSpotAcceleration(), 
   _targetEntityID(), 
   _targetComponentID(0), 
   _SpotShape(0), 
   _BeamSpotXSecSemiMajorAxis(0), 
   _BeamSpotCrossSectionSemiMinorAxis(0), 
   _BeamSpotCrossSectionOrientAngle(0)
{
}